

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict abstract_declarator(c2m_ctx_t c2m_ctx,int no_err_p)

{
  node_t_conflict pnVar1;
  node_t_conflict pnVar2;
  pos_t p_00;
  node_t_conflict next_el;
  node_t_conflict el;
  node_t_conflict r;
  node_t_conflict p;
  node_t_conflict list;
  parse_ctx_t parse_ctx;
  int no_err_p_local;
  c2m_ctx_t c2m_ctx_local;
  
  r = (node_t_conflict)0x0;
  if ((short)*(undefined4 *)c2m_ctx->parse_ctx->curr_token == 0x2a) {
    r = pointer(c2m_ctx,no_err_p);
    if (r == &err_struct) {
      return &err_struct;
    }
    el = try_f(c2m_ctx,direct_abstract_declarator);
    if (el == &err_struct) {
      p_00 = get_node_pos(c2m_ctx,r);
      pnVar1 = new_node(c2m_ctx,N_IGNORE);
      pnVar2 = new_node(c2m_ctx,N_LIST);
      el = new_pos_node2(c2m_ctx,N_DECL,p_00,pnVar1,pnVar2);
    }
  }
  else {
    el = direct_abstract_declarator(c2m_ctx,no_err_p);
    if (el == &err_struct) {
      return el;
    }
  }
  if (r != (node_t_conflict)0x0) {
    pnVar1 = DLIST_node_t_head(&(el->u).ops);
    pnVar1 = DLIST_node_t_next(pnVar1);
    if (pnVar1->code != N_LIST) {
      __assert_fail("list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x1366,"node_t abstract_declarator(c2m_ctx_t, int)");
    }
    next_el = DLIST_node_t_head(&(r->u).ops);
    while (next_el != (node_t_conflict)0x0) {
      pnVar2 = DLIST_node_t_next(next_el);
      DLIST_node_t_remove(&(r->u).ops,next_el);
      op_append(c2m_ctx,pnVar1,next_el);
      next_el = pnVar2;
    }
  }
  return el;
}

Assistant:

D (abstract_declarator) {
  parse_ctx_t parse_ctx = c2m_ctx->parse_ctx;
  node_t list, p = NULL, r, el, next_el;

  if (C ('*')) {
    P (pointer);
    p = r;
    if ((r = TRY (direct_abstract_declarator)) == err_node)
      r = new_pos_node2 (c2m_ctx, N_DECL, POS (p), new_node (c2m_ctx, N_IGNORE),
                         new_node (c2m_ctx, N_LIST));
  } else {
    P (direct_abstract_declarator);
  }
  if (p != NULL) {
    list = NL_NEXT (NL_HEAD (r->u.ops));
    assert (list->code == N_LIST);
    for (el = NL_HEAD (p->u.ops); el != NULL; el = next_el) {
      next_el = NL_NEXT (el);
      NL_REMOVE (p->u.ops, el);
      op_append (c2m_ctx, list, el);
    }
  }
  return r;
}